

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O2

btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
 __thiscall
phmap::priv::
base_checker<phmap::btree_set<std::__cxx11::string,phmap::Less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
::
iter_check<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::string,phmap::Less<std::__cxx11::string>,std::allocator<std::__cxx11::string>,256,false>>,std::__cxx11::string&,std::__cxx11::string*>,std::_Rb_tree_const_iterator<std::__cxx11::string>>
          (base_checker<phmap::btree_set<std::__cxx11::string,phmap::Less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
           *this,btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                 tree_iter,
          _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          checker_iter)

{
  reference x;
  int iVar1;
  btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>
  *pbVar2;
  const_iterator cVar3;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  bVar4;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  tree_iter_local;
  
  pbVar2 = tree_iter.node;
  iVar1 = tree_iter.position;
  tree_iter_local.node = pbVar2;
  tree_iter_local.position = iVar1;
  cVar3 = btree<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>
          ::end((btree<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>
                 *)this);
  if (cVar3.position == iVar1 && cVar3.node == pbVar2) {
    if ((_Base_ptr)(this + 0x28) != checker_iter._M_node) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                    ,0x7d,
                    "IterType phmap::priv::base_checker<phmap::btree_set<std::basic_string<char>>, std::set<std::basic_string<char>>>::iter_check(IterType, CheckerIterType) const [TreeType = phmap::btree_set<std::basic_string<char>>, CheckerType = std::set<std::basic_string<char>>, IterType = phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::basic_string<char>, phmap::Less<std::basic_string<char>>, std::allocator<std::basic_string<char>>, 256, false>>, std::basic_string<char> &, std::basic_string<char> *>, CheckerIterType = std::_Rb_tree_const_iterator<std::basic_string<char>>]"
                   );
    }
  }
  else {
    x = btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
        ::operator*(&tree_iter_local);
    (anonymous_namespace)::CheckPairEquals<std::__cxx11::string,std::__cxx11::string>
              (x,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (checker_iter._M_node + 1));
    pbVar2 = tree_iter_local.node;
    iVar1 = tree_iter_local.position;
  }
  bVar4.position = iVar1;
  bVar4.node = pbVar2;
  bVar4._12_4_ = 0;
  return bVar4;
}

Assistant:

IterType iter_check(IterType tree_iter, CheckerIterType checker_iter) const {
        if (tree_iter == tree_.end()) {
            PHMAP_INTERNAL_CHECK(checker_iter == checker_.end(),
                                 "Checker iterator not at end.");
        } else {
            CheckPairEquals(*tree_iter, *checker_iter);
        }
        return tree_iter;
    }